

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlmemory.c
# Opt level: O0

void * xmlReallocLoc(void *ptr,size_t size,char *file,int line)

{
  ulong uVar1;
  xmlGenericErrorFunc p_Var2;
  void *pvVar3;
  int *__ptr;
  xmlGenericErrorFunc *pp_Var4;
  void **ppvVar5;
  undefined4 *puVar6;
  unsigned_long number;
  MEMHDR *tmp;
  MEMHDR *p;
  int line_local;
  char *file_local;
  size_t size_local;
  void *ptr_local;
  
  if (ptr == (void *)0x0) {
    pvVar3 = xmlMallocLoc(size,file,line);
    return pvVar3;
  }
  if (xmlMemInitialized == 0) {
    xmlInitMemory();
  }
  __ptr = (int *)((long)ptr + -0x28);
  uVar1 = *(ulong *)((long)ptr + -0x20);
  if (xmlMemStopAtBlock == uVar1) {
    xmlMallocBreakpoint();
  }
  if (*__ptr == 0x5aa5) {
    *__ptr = -0x5aa6;
    xmlMutexLock(xmlMemMutex);
    debugMemSize = debugMemSize - *(long *)((long)ptr + -0x18);
    debugMemBlocks = debugMemBlocks - 1;
    xmlMutexUnlock(xmlMemMutex);
    if (0xffffffffffffffd7 < size) {
      pp_Var4 = __xmlGenericError();
      p_Var2 = *pp_Var4;
      ppvVar5 = __xmlGenericErrorContext();
      (*p_Var2)(*ppvVar5,"xmlReallocLoc : Unsigned overflow\n");
      xmlMemoryDump();
      return (void *)0x0;
    }
    puVar6 = (undefined4 *)realloc(__ptr,size + 0x28);
    if (puVar6 != (undefined4 *)0x0) {
      if (xmlMemTraceBlockAt == ptr) {
        pp_Var4 = __xmlGenericError();
        p_Var2 = *pp_Var4;
        ppvVar5 = __xmlGenericErrorContext();
        (*p_Var2)(*ppvVar5,"%p : Realloced(%lu -> %lu) Ok\n",xmlMemTraceBlockAt,
                  *(undefined8 *)(puVar6 + 4),size);
        xmlMallocBreakpoint();
      }
      *puVar6 = 0x5aa5;
      *(ulong *)(puVar6 + 2) = uVar1;
      puVar6[1] = 2;
      *(size_t *)(puVar6 + 4) = size;
      *(char **)(puVar6 + 6) = file;
      puVar6[8] = line;
      xmlMutexLock(xmlMemMutex);
      debugMemSize = size + debugMemSize;
      debugMemBlocks = debugMemBlocks + 1;
      if (debugMaxMemSize < debugMemSize) {
        debugMaxMemSize = debugMemSize;
      }
      xmlMutexUnlock(xmlMemMutex);
      return puVar6 + 10;
    }
    free(__ptr);
  }
  else {
    debugmem_tag_error(__ptr);
  }
  return (void *)0x0;
}

Assistant:

void *
xmlReallocLoc(void *ptr,size_t size, const char * file, int line)
{
    MEMHDR *p, *tmp;
    unsigned long number;
#ifdef DEBUG_MEMORY
    size_t oldsize;
#endif

    if (ptr == NULL)
        return(xmlMallocLoc(size, file, line));

    if (!xmlMemInitialized) xmlInitMemory();
    TEST_POINT

    p = CLIENT_2_HDR(ptr);
    number = p->mh_number;
    if (xmlMemStopAtBlock == number) xmlMallocBreakpoint();
    if (p->mh_tag != MEMTAG) {
       Mem_Tag_Err(p);
	 goto error;
    }
    p->mh_tag = ~MEMTAG;
    xmlMutexLock(xmlMemMutex);
    debugMemSize -= p->mh_size;
    debugMemBlocks--;
#ifdef DEBUG_MEMORY
    oldsize = p->mh_size;
#endif
#ifdef MEM_LIST
    debugmem_list_delete(p);
#endif
    xmlMutexUnlock(xmlMemMutex);

    if (size > (MAX_SIZE_T - RESERVE_SIZE)) {
	xmlGenericError(xmlGenericErrorContext,
		"xmlReallocLoc : Unsigned overflow\n");
	xmlMemoryDump();
	return(NULL);
    }

    tmp = (MEMHDR *) realloc(p,RESERVE_SIZE+size);
    if (!tmp) {
	 free(p);
	 goto error;
    }
    p = tmp;
    if (xmlMemTraceBlockAt == ptr) {
	xmlGenericError(xmlGenericErrorContext,
			"%p : Realloced(%lu -> %lu) Ok\n",
			xmlMemTraceBlockAt, (long unsigned)p->mh_size,
			(long unsigned)size);
	xmlMallocBreakpoint();
    }
    p->mh_tag = MEMTAG;
    p->mh_number = number;
    p->mh_type = REALLOC_TYPE;
    p->mh_size = size;
    p->mh_file = file;
    p->mh_line = line;
    xmlMutexLock(xmlMemMutex);
    debugMemSize += size;
    debugMemBlocks++;
    if (debugMemSize > debugMaxMemSize) debugMaxMemSize = debugMemSize;
#ifdef MEM_LIST
    debugmem_list_add(p);
#endif
    xmlMutexUnlock(xmlMemMutex);

    TEST_POINT

#ifdef DEBUG_MEMORY
    xmlGenericError(xmlGenericErrorContext,
	    "Realloced(%d to %d) Ok\n", oldsize, size);
#endif
    return(HDR_2_CLIENT(p));

error:
    return(NULL);
}